

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O2

uint16_t add_unique(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *data,vector<unsigned_short,_std::allocator<unsigned_short>_> *uniq_refs,
                   string *new_data,size_t hint)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  __type _Var2;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  uint16_t uVar3;
  long lVar4;
  uint16_t idx;
  uint16_t local_3a;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_38;
  
  __lhs_00 = (data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (data->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = uniq_refs;
  for (lVar4 = hint << 5;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(__lhs_00->_M_dataplus)._M_p + lVar4), __lhs != pbVar1; lVar4 = lVar4 + 0x20)
  {
    _Var2 = std::operator==(__lhs,new_data);
    if (_Var2) {
      return (uint16_t)((uint)lVar4 >> 5);
    }
  }
  lVar4 = hint << 5;
  uVar3 = 0;
  while( true ) {
    if (lVar4 == 0) {
      local_3a = (uint16_t)
                 ((uint)(*(int *)&(data->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                        *(int *)&(data->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(data,new_data);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(local_38,&local_3a);
      return local_3a;
    }
    _Var2 = std::operator==(__lhs_00,new_data);
    if (_Var2) break;
    __lhs_00 = __lhs_00 + 1;
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + -0x20;
  }
  return uVar3;
}

Assistant:

static uint16_t add_unique(std::vector<std::string>* data, std::vector<uint16_t>& uniq_refs,
		const std::string& new_data, size_t hint)
{
	std::vector<std::string>::iterator it0 = data->begin();
	for (std::vector<std::string>::iterator it = it0 + hint,
			end = data->end(); it != end; ++it) {
		if (*it == new_data)
			return uint16_t((it - it0) & UINT16_MAX);
	}
	for (std::vector<std::string>::iterator it = it0,
			end = it0 + hint; it != end; ++it) {
		if (*it == new_data)
			return uint16_t((it - it0) & UINT16_MAX);
	}
	uint16_t idx = uint16_t(data->size() & UINT16_MAX);
	data->push_back(new_data);
	uniq_refs.push_back(idx);
	return idx;
}